

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

IndirOpnd * __thiscall
Lowerer::GetArgsIndirOpndForInlinee(Lowerer *this,Instr *ldElem,Opnd *valueOpnd)

{
  code *pcVar1;
  bool bVar2;
  BYTE scale;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  StackSym *stackSym;
  RegOpnd *dst;
  IntConstOpnd *pIVar5;
  IndirOpnd *pIVar6;
  RegOpnd *indexOpnd;
  undefined1 local_60 [8];
  AutoReuseOpnd autoReuseFirstArg;
  AutoReuseOpnd autoReuseBaseOpnd;
  
  bVar2 = Func::IsInlinee(ldElem->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5637,"(ldElem->m_func->IsInlinee())","ldElem->m_func->IsInlinee()");
    if (!bVar2) goto LAB_0057ee14;
    *puVar3 = 0;
  }
  pSVar4 = Func::GetInlineeArgvSlotOpnd(ldElem->m_func);
  stackSym = Sym::AsStackSym(pSVar4->m_sym);
  Func::SetArgOffset(this->m_func,stackSym,stackSym->m_offset + 8);
  pSVar4 = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,ldElem->m_func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_60,&pSVar4->super_Opnd,this->m_func,true);
  dst = IR::RegOpnd::New(TyInt64,ldElem->m_func);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete,&dst->super_Opnd,this->m_func,true);
  InsertLea(dst,&pSVar4->super_Opnd,ldElem);
  bVar2 = IR::Opnd::IsIntConstOpnd(valueOpnd);
  if (bVar2) {
    pIVar5 = IR::Opnd::AsIntConstOpnd(valueOpnd);
    pIVar6 = IR::IndirOpnd::New(dst,(int)(pIVar5->super_EncodableOpnd<long>).m_value << 3,TyInt64,
                                ldElem->m_func,false);
  }
  else {
    bVar2 = IR::Opnd::IsRegOpnd(valueOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x564c,"(valueOpnd->IsRegOpnd())","valueOpnd->IsRegOpnd()");
      if (!bVar2) {
LAB_0057ee14:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    scale = LowererMDArch::GetDefaultIndirScale();
    indexOpnd = IR::Opnd::AsRegOpnd(valueOpnd);
    pIVar6 = IR::IndirOpnd::New(dst,indexOpnd,scale,TyInt64,ldElem->m_func);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_60);
  return pIVar6;
}

Assistant:

IR::IndirOpnd*
Lowerer::GetArgsIndirOpndForInlinee(IR::Instr* ldElem, IR::Opnd* valueOpnd)
{
    Assert(ldElem->m_func->IsInlinee());
    IR::IndirOpnd* argIndirOpnd = nullptr;

    // Address of argument after 'this'
    const auto firstRealArgStackSym = ldElem->m_func->GetInlineeArgvSlotOpnd()->m_sym->AsStackSym();
    this->m_func->SetArgOffset(firstRealArgStackSym, firstRealArgStackSym->m_offset + MachPtr); //Start after this pointer
    IR::SymOpnd *firstArg = IR::SymOpnd::New(firstRealArgStackSym, TyMachPtr, ldElem->m_func);
    const IR::AutoReuseOpnd autoReuseFirstArg(firstArg, m_func);

    IR::RegOpnd *const baseOpnd = IR::RegOpnd::New(TyMachReg, ldElem->m_func);
    const IR::AutoReuseOpnd autoReuseBaseOpnd(baseOpnd, m_func);
    InsertLea(baseOpnd, firstArg, ldElem);

    if (valueOpnd->IsIntConstOpnd())
    {
        IntConstType offset = valueOpnd->AsIntConstOpnd()->GetValue() * MachPtr;
        // TODO: Assert(Math::FitsInDWord(offset));
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, ldElem->m_func);
    }
    else
    {
        Assert(valueOpnd->IsRegOpnd());
        const BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, valueOpnd->AsRegOpnd(), indirScale, TyMachReg, ldElem->m_func);
    }
    return argIndirOpnd;
}